

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-profile.c
# Opt level: O0

int luaopen_profile(lua_State *L)

{
  int idx;
  lua_CFunction p_Var1;
  lua_CFunction co_yield;
  lua_CFunction co_resume;
  undefined1 local_68 [4];
  int libtable;
  luaL_Reg l [5];
  lua_State *L_local;
  
  l[4].func = (lua_CFunction)L;
  luaL_checkversion_(L,503.0,0x88);
  memcpy(local_68,&DAT_00184ba0,0x50);
  lua_createtable((lua_State *)l[4].func,0,4);
  lua_createtable((lua_State *)l[4].func,0,0);
  lua_createtable((lua_State *)l[4].func,0,0);
  lua_createtable((lua_State *)l[4].func,0,0);
  lua_pushstring((lua_State *)l[4].func,"kv");
  lua_setfield((lua_State *)l[4].func,-2,"__mode");
  lua_pushvalue((lua_State *)l[4].func,-1);
  lua_setmetatable((lua_State *)l[4].func,-3);
  lua_setmetatable((lua_State *)l[4].func,-3);
  lua_pushnil((lua_State *)l[4].func);
  luaL_setfuncs((lua_State *)l[4].func,(luaL_Reg *)local_68,3);
  idx = lua_gettop((lua_State *)l[4].func);
  lua_getglobal((lua_State *)l[4].func,"coroutine");
  lua_getfield((lua_State *)l[4].func,-1,"resume");
  p_Var1 = lua_tocfunction((lua_State *)l[4].func,-1);
  if (p_Var1 == (lua_CFunction)0x0) {
    L_local._4_4_ = luaL_error((lua_State *)l[4].func,"Can\'t get coroutine.resume");
  }
  else {
    lua_settop((lua_State *)l[4].func,-2);
    lua_getfield((lua_State *)l[4].func,idx,"resume");
    lua_pushcclosure((lua_State *)l[4].func,p_Var1,0);
    lua_setupvalue((lua_State *)l[4].func,-2,3);
    lua_settop((lua_State *)l[4].func,-2);
    lua_getfield((lua_State *)l[4].func,-1,"yield");
    p_Var1 = lua_tocfunction((lua_State *)l[4].func,-1);
    if (p_Var1 == (lua_CFunction)0x0) {
      L_local._4_4_ = luaL_error((lua_State *)l[4].func,"Can\'t get coroutine.yield");
    }
    else {
      lua_settop((lua_State *)l[4].func,-2);
      lua_getfield((lua_State *)l[4].func,idx,"yield");
      lua_pushcclosure((lua_State *)l[4].func,p_Var1,0);
      lua_setupvalue((lua_State *)l[4].func,-2,3);
      lua_settop((lua_State *)l[4].func,idx);
      L_local._4_4_ = 1;
    }
  }
  return L_local._4_4_;
}

Assistant:

int
luaopen_profile(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] = {
		{ "start", lstart },
		{ "stop", lstop },
		{ "resume", lresume },
		{ "yield", lyield },
		{ NULL, NULL },
	};
	luaL_newlibtable(L,l);
	lua_newtable(L);	// table thread->start time
	lua_newtable(L);	// table thread->total time

	lua_newtable(L);	// weak table
	lua_pushliteral(L, "kv");
	lua_setfield(L, -2, "__mode");

	lua_pushvalue(L, -1);
	lua_setmetatable(L, -3); 
	lua_setmetatable(L, -3);

	lua_pushnil(L);
	luaL_setfuncs(L,l,3);

	int libtable = lua_gettop(L);

	lua_getglobal(L, "coroutine");
	lua_getfield(L, -1, "resume");

	lua_CFunction co_resume = lua_tocfunction(L, -1);
	if (co_resume == NULL)
		return luaL_error(L, "Can't get coroutine.resume");
	lua_pop(L,1);
	lua_getfield(L, libtable, "resume");
	lua_pushcfunction(L, co_resume);
	lua_setupvalue(L, -2, 3);
	lua_pop(L,1);

	lua_getfield(L, -1, "yield");

	lua_CFunction co_yield = lua_tocfunction(L, -1);
	if (co_yield == NULL)
		return luaL_error(L, "Can't get coroutine.yield");
	lua_pop(L,1);
	lua_getfield(L, libtable, "yield");
	lua_pushcfunction(L, co_yield);
	lua_setupvalue(L, -2, 3);

	lua_settop(L, libtable);

	return 1;
}